

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *expected_expression,char *actual_expression,string *expected_value,
          string *actual_value,bool ignoring_case)

{
  bool bVar1;
  Message *pMVar2;
  AssertionResult *other;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  AssertionResult local_60 [2];
  Message local_40;
  Message msg;
  bool ignoring_case_local;
  string *actual_value_local;
  string *expected_value_local;
  char *actual_expression_local;
  char *expected_expression_local;
  
  msg.ss_.ptr_._7_1_ = ignoring_case;
  expected_value_local = (string *)actual_expression;
  actual_expression_local = expected_expression;
  expected_expression_local = (char *)this;
  Message::Message(&local_40);
  pMVar2 = Message::operator<<(&local_40,(char (*) [11])"Value of: ");
  Message::operator<<(pMVar2,(char **)&expected_value_local);
  bVar1 = std::operator!=(actual_value,(char *)expected_value_local);
  if (bVar1) {
    pMVar2 = Message::operator<<(&local_40,(char (*) [12])"\n  Actual: ");
    Message::operator<<(pMVar2,actual_value);
  }
  pMVar2 = Message::operator<<(&local_40,(char (*) [12])"\nExpected: ");
  Message::operator<<(pMVar2,&actual_expression_local);
  if ((msg.ss_.ptr_._7_1_ & 1) != 0) {
    Message::operator<<(&local_40,(char (*) [17])" (ignoring case)");
  }
  bVar1 = std::operator!=(expected_value,actual_expression_local);
  if (bVar1) {
    pMVar2 = Message::operator<<(&local_40,(char (*) [12])"\nWhich is: ");
    Message::operator<<(pMVar2,expected_value);
  }
  AssertionFailure();
  other = AssertionResult::operator<<(local_60,&local_40);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  AssertionResult::~AssertionResult((AssertionResult *)0x14a39c);
  Message::~Message((Message *)0x14a3a5);
  AVar3.message_.ptr_ = extraout_RDX.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const std::string& expected_value,
                          const std::string& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}